

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O0

void __thiscall
ram::MinimizerEngine::MinimizerEngine
          (MinimizerEngine *this,shared_ptr<thread_pool::ThreadPool> *thread_pool,uint32_t k,
          uint32_t w,uint32_t bandwidth,uint32_t chain,uint32_t matches,uint32_t gap)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  allocator<ram::MinimizerEngine::Index> local_39;
  uint local_38 [4];
  uint32_t local_28;
  uint32_t local_24;
  uint32_t chain_local;
  uint32_t bandwidth_local;
  uint32_t w_local;
  uint32_t k_local;
  shared_ptr<thread_pool::ThreadPool> *thread_pool_local;
  MinimizerEngine *this_local;
  
  local_38[3] = 1;
  local_28 = chain;
  local_24 = bandwidth;
  chain_local = w;
  bandwidth_local = k;
  _w_local = thread_pool;
  thread_pool_local = (shared_ptr<thread_pool::ThreadPool> *)this;
  puVar3 = std::max<unsigned_int>(&bandwidth_local,local_38 + 3);
  local_38[2] = 0x1f;
  puVar3 = std::min<unsigned_int>(puVar3,local_38 + 2);
  this->k_ = *puVar3;
  this->w_ = chain_local;
  this->bandwidth_ = local_24;
  this->chain_ = local_28;
  this->matches_ = matches;
  this->gap_ = (ulong)gap;
  this->occurrence_ = 0xffffffff;
  local_38[1] = 0xe;
  local_38[0] = this->k_ * 2;
  puVar3 = std::min<unsigned_int>(local_38 + 1,local_38);
  uVar1 = *puVar3;
  std::allocator<ram::MinimizerEngine::Index>::allocator(&local_39);
  std::vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>::vector
            (&this->index_,(ulong)(uint)(1 << ((byte)uVar1 & 0x1f)),&local_39);
  std::allocator<ram::MinimizerEngine::Index>::~allocator(&local_39);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)thread_pool);
  if (bVar2) {
    std::shared_ptr<thread_pool::ThreadPool>::shared_ptr(&this->thread_pool_,thread_pool);
  }
  else {
    std::make_shared<thread_pool::ThreadPool,int>((int *)&this->thread_pool_);
  }
  return;
}

Assistant:

MinimizerEngine::MinimizerEngine(
    std::shared_ptr<thread_pool::ThreadPool> thread_pool,
    std::uint32_t k,
    std::uint32_t w,
    std::uint32_t bandwidth,
    std::uint32_t chain,
    std::uint32_t matches,
    std::uint32_t gap)
    : k_(std::min(std::max(k, 1U), 31U)),
      w_(w),
      bandwidth_(bandwidth),
      chain_(chain),
      matches_(matches),
      gap_(gap),
      occurrence_(-1),
      index_(1U << std::min(14U, 2 * k_)),
      thread_pool_(thread_pool ?
          thread_pool :
          std::make_shared<thread_pool::ThreadPool>(1)) {}